

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_ini_writer::
w_ini_seq<std::vector<xray_re::sector_item,std::allocator<xray_re::sector_item>>,write_ini_item>
          (xr_ini_writer *this,undefined8 *container)

{
  sector_item *psVar1;
  uint32_t id;
  sector_item *item;
  write_ini_item local_29;
  
  psVar1 = (sector_item *)container[1];
  id = 0;
  for (item = (sector_item *)*container; item != psVar1; item = item + 1) {
    write_ini_item::operator()(&local_29,item,this,id);
    id = id + 1;
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_ini_seq(const T& container, F write)
{
	uint32_t id = 0;
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it, ++id) {
		write(*it, this, id);
	}
}